

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall compressed_sparse_matrix<int>::push_back(compressed_sparse_matrix<int> *this,int e)

{
  _Elt_pointer puVar1;
  int local_c;
  
  local_c = e;
  std::deque<int,_std::allocator<int>_>::push_back(&this->entries,&local_c);
  puVar1 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar1 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  puVar1[-1] = puVar1[-1] + 1;
  return;
}

Assistant:

void push_back(ValueType e) {
		assert(0 < size());
		entries.push_back(e);
		++bounds.back();
	}